

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddxEa<(moira::Instr)122,(moira::Mode)4,(moira::Size)2>(Moira *this,u16 opcode)

{
  int *piVar1;
  u32 uVar2;
  u32 addr;
  u32 uVar3;
  uint n;
  bool error;
  bool error_1;
  bool local_2a;
  bool local_29;
  
  uVar2 = computeEA<(moira::Mode)4,(moira::Size)2,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)2,64ul>(this,uVar2,&local_2a);
  piVar1 = (int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  *piVar1 = *piVar1 + -2;
  if (local_2a == false) {
    n = opcode >> 9 & 7;
    (*this->_vptr_Moira[0x19])(this,0xfffffffe);
    addr = computeEA<(moira::Mode)4,(moira::Size)2,0ul>(this,n);
    uVar3 = readM<(moira::MemSpace)1,(moira::Size)2,64ul>(this,addr,&local_29);
    piVar1 = (int *)((long)this->exec + (ulong)n * 4 + -0x38);
    *piVar1 = *piVar1 + -2;
    if (local_29 == false) {
      uVar3 = addsub<(moira::Instr)122,(moira::Size)2>(this,uVar2,uVar3);
      uVar2 = (this->reg).pc;
      (this->reg).pc0 = uVar2;
      (this->queue).ird = (this->queue).irc;
      uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
      (this->queue).irc = (u16)uVar2;
      writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr,uVar3);
    }
  }
  return;
}

Assistant:

void
Moira::execAddxEa(u16 opcode)
{
    const u64 flags =
    (S == Word) ? AE_INC_PC : (S == Long) ? AE_INC_PC | AE_INC_ADDR : 0;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea1, ea2, data1, data2;
 
    if (!readOp<M,S, flags>(src, ea1, data1)) {
        if (S == Long) undoAnPD<M,S>(src);
        return;
    }
    
    sync(-2);
    
    if (!readOp<M,S, flags>(dst, ea2, data2)) {
        if (S == Long) undoAnPD<M,S>(dst);
        return;
    }

    u32 result = addsub<I,S>(data1, data2);

    if (S == Long && !MIMIC_MUSASHI) {
        writeM <M, Word> (ea2 + 2, result & 0xFFFF);
        prefetch();
        writeM<M, Word, POLLIPL>(ea2, result >> 16);
        return;
    }

    prefetch();
    writeM<M, S, POLLIPL>(ea2, result);
}